

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmCmp<(moira::Instr)37,(moira::Mode)10,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  StrWriter *pSVar5;
  char *pcVar6;
  char cVar7;
  Ea<(moira::Mode)10,_(moira::Size)1> src;
  Ea<(moira::Mode)10,_(moira::Size)1> local_2c;
  
  Op<(moira::Mode)10,(moira::Size)1>(&local_2c,this,op & 7,addr);
  bVar4 = str->upper;
  pcVar6 = "cmp";
  if ((bool)bVar4 != false) {
    pcVar6 = "CMP";
  }
  cVar7 = *pcVar6;
  if (cVar7 != '\0') {
    do {
      pcVar6 = pcVar6 + 1;
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar7;
      cVar7 = *pcVar6;
    } while (cVar7 != '\0');
    bVar4 = str->upper;
  }
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = '.';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (~bVar4 & 1) << 5 | 0x42;
  iVar1 = (this->tab).raw;
  while (pcVar6 = str->ptr, pcVar6 < str->base + iVar1) {
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  pSVar5 = StrWriter::operator<<(str,&local_2c);
  pcVar6 = pSVar5->ptr;
  pSVar5->ptr = pcVar6 + 1;
  *pcVar6 = ',';
  pcVar6 = pSVar5->ptr;
  pSVar5->ptr = pcVar6 + 1;
  *pcVar6 = ' ';
  pcVar6 = pSVar5->ptr;
  pSVar5->ptr = pcVar6 + 1;
  *pcVar6 = 'D';
  pbVar3 = (byte *)pSVar5->ptr;
  pSVar5->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)(op >> 9) & 7 | 0x30;
  return;
}

Assistant:

void
Moira::dasmCmp(StrWriter &str, u32 &addr, u16 op)
{
    Ea<M,S> src = Op <M,S> ( _____________xxx(op), addr );
    Dn      dst = Dn       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}